

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mprintf.c
# Opt level: O1

int dollarstring(char *input,char **end)

{
  char cVar1;
  int iVar2;
  char *pcVar3;
  
  if ((byte)(*input - 0x30U) < 10) {
    pcVar3 = input + 1;
    iVar2 = 0;
    do {
      if (iVar2 < 0x80) {
        iVar2 = (int)pcVar3[-1] + iVar2 * 10 + -0x30;
      }
      cVar1 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while ((byte)(cVar1 - 0x30U) < 10);
    if (cVar1 == '$' && (iVar2 < 0x81 && iVar2 != 0)) {
      *end = pcVar3;
      return iVar2 + -1;
    }
  }
  return -1;
}

Assistant:

static int dollarstring(char *input, char **end)
{
  if(ISDIGIT(*input)) {
    int number = 0;
    do {
      if(number < MAX_PARAMETERS) {
        number *= 10;
        number += *input - '0';
      }
      input++;
    } while(ISDIGIT(*input));

    if(number && (number <= MAX_PARAMETERS) && ('$' == *input)) {
      *end = ++input;
      return number - 1;
    }
  }
  return -1;
}